

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int MRIStepEvolve(void *arkode_mem,realtype tout,N_Vector yout,realtype *tret,int itask)

{
  long in_RDI;
  ARKodeMem ark_mem;
  int retval;
  int in_stack_0000003c;
  realtype *in_stack_00000040;
  N_Vector in_stack_00000048;
  realtype in_stack_00000050;
  ARKodeMem in_stack_00000058;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::MRIStep","MRIStepEvolve",
                    "arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    local_4 = arkEvolve(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
                        in_stack_0000003c);
  }
  return local_4;
}

Assistant:

int MRIStepEvolve(void *arkode_mem, realtype tout, N_Vector yout,
                  realtype *tret, int itask)
{
  /* unpack ark_mem, call arkEvolve, and return */
  int retval;
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::MRIStep",
                    "MRIStepEvolve", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  SUNDIALS_MARK_FUNCTION_BEGIN(ARK_PROFILER);
  retval = arkEvolve(ark_mem, tout, yout, tret, itask);
  SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
  return(retval);
}